

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.h
# Opt level: O2

int aom_get_qmlevel_luma_ssimulacra2(int qindex,int first,int last)

{
  int iVar1;
  
  if (qindex < 0x29) {
    iVar1 = 10;
  }
  else if ((uint)qindex < 0x3d) {
    iVar1 = 9;
  }
  else if ((uint)qindex < 0x65) {
    iVar1 = 8;
  }
  else if ((uint)qindex < 0x79) {
    iVar1 = 7;
  }
  else if ((uint)qindex < 0x8d) {
    iVar1 = 6;
  }
  else if ((uint)qindex < 0xa1) {
    iVar1 = 5;
  }
  else if ((uint)qindex < 0xc9) {
    iVar1 = 4;
  }
  else {
    iVar1 = ((uint)qindex < 0xdd) + 2;
  }
  if (iVar1 < last) {
    last = iVar1;
  }
  if (iVar1 < first) {
    last = first;
  }
  return last;
}

Assistant:

static inline int aom_get_qmlevel_luma_ssimulacra2(int qindex, int first,
                                                   int last) {
  int qm_level = 0;

  if (qindex <= 40) {
    qm_level = 10;
  } else if (qindex <= 60) {
    qm_level = 9;
  } else if (qindex <= 100) {
    qm_level = 8;
  } else if (qindex <= 120) {
    qm_level = 7;
  } else if (qindex <= 140) {
    qm_level = 6;
  } else if (qindex <= 160) {
    qm_level = 5;
  } else if (qindex <= 200) {
    qm_level = 4;
  } else if (qindex <= 220) {
    qm_level = 3;
  } else {
    qm_level = 2;
  }

  return clamp(qm_level, first, last);
}